

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Tracer.cpp
# Opt level: O2

void __thiscall
helics::apps::Tracer::captureForCurrentTime(Tracer *this,Time currentTime,int iteration)

{
  _Elt_pointer pIVar1;
  bool bVar2;
  string *psVar3;
  ostream *poVar4;
  Endpoint *this_00;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  _Elt_pointer pIVar5;
  _Elt_pointer this_01;
  _Elt_pointer this_02;
  double dVar6;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  basic_string_view<char,_std::char_traits<char>_> __args_1;
  string_view fmt_03;
  string_view fmt_04;
  basic_string_view<char,_std::char_traits<char>_> __args_1_00;
  string_view fmt_05;
  string_view fmt_06;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  basic_string_view<char,_std::char_traits<char>_> __args_2;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> val;
  double local_e8 [2];
  pointer local_d8;
  size_type sStack_d0;
  pointer local_c8;
  size_type sStack_c0;
  pointer local_b8;
  pointer pcStack_b0;
  _Elt_pointer local_a0;
  function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
  *local_98;
  TimeRepresentation<count_time<9,_long>_> local_90;
  string valstr;
  _Elt_pointer local_68;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> local_60;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> local_58;
  unique_ptr<helics::Message,_std::default_delete<helics::Message>_> mess;
  
  this_01 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
            _M_impl.super__Deque_impl_data._M_start._M_cur;
  pIVar5 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
           _M_impl.super__Deque_impl_data._M_start._M_last;
  local_a0 = (_Elt_pointer)
             (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
             _M_impl.super__Deque_impl_data._M_start._M_node;
  pIVar1 = (this->subscriptions).super__Deque_base<helics::Input,_std::allocator<helics::Input>_>.
           _M_impl.super__Deque_impl_data._M_finish._M_cur;
  dVar6 = (double)(currentTime.internalTimeCode % 1000000000) * 1e-09 +
          (double)(currentTime.internalTimeCode / 1000000000);
  local_98 = &this->valueCallback;
  local_90.internalTimeCode = currentTime.internalTimeCode;
  while (this_01 != pIVar1) {
    bVar2 = Input::isUpdated(this_01);
    if (bVar2) {
      Input::getValue_impl<std::__cxx11::string>(&val,this_01);
      if (this->printMessage == true) {
        valstr._M_dataplus._M_p = (pointer)&valstr.field_2;
        valstr._M_string_length = 0;
        valstr.field_2._M_local_buf[0] = '\0';
        if (val._M_string_length < 0x96) {
          if (iteration < 1) {
            psVar3 = Input::getTarget_abi_cxx11_(this_01);
            local_d8 = (psVar3->_M_dataplus)._M_p;
            sStack_d0 = psVar3->_M_string_length;
            local_c8 = val._M_dataplus._M_p;
            sStack_c0 = val._M_string_length;
            fmt_01.size_ = 0xdda;
            fmt_01.data_ = (char *)0xf;
            args_01.field_1.values_ = in_R9.values_;
            args_01.desc_ = (unsigned_long_long)local_e8;
            local_e8[0] = dVar6;
            ::fmt::v11::vformat_abi_cxx11_((string *)&mess,(v11 *)"[{}]value {}={}",fmt_01,args_01);
          }
          else {
            psVar3 = Input::getTarget_abi_cxx11_(this_01);
            local_d8 = (pointer)CONCAT44(local_d8._4_4_,iteration);
            local_c8 = (psVar3->_M_dataplus)._M_p;
            sStack_c0 = psVar3->_M_string_length;
            local_b8 = val._M_dataplus._M_p;
            pcStack_b0 = (pointer)val._M_string_length;
            fmt.size_ = 0xdd1a;
            fmt.data_ = (char *)0x12;
            args.field_1.values_ = in_R9.values_;
            args.desc_ = (unsigned_long_long)local_e8;
            local_e8[0] = dVar6;
            ::fmt::v11::vformat_abi_cxx11_((string *)&mess,(v11 *)"[{}:{}]value {}={}",fmt,args);
          }
        }
        else if (iteration < 1) {
          psVar3 = Input::getTarget_abi_cxx11_(this_01);
          local_d8 = (psVar3->_M_dataplus)._M_p;
          sStack_d0 = psVar3->_M_string_length;
          local_c8 = (pointer)val._M_string_length;
          fmt_02.size_ = 0x4da;
          fmt_02.data_ = (char *)0x16;
          args_02.field_1.values_ = in_R9.values_;
          args_02.desc_ = (unsigned_long_long)local_e8;
          local_e8[0] = dVar6;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&mess,(v11 *)"[{}]value {}=block[{}]",fmt_02,args_02);
        }
        else {
          psVar3 = Input::getTarget_abi_cxx11_(this_01);
          local_d8 = (pointer)CONCAT44(local_d8._4_4_,iteration);
          local_c8 = (psVar3->_M_dataplus)._M_p;
          sStack_c0 = psVar3->_M_string_length;
          local_b8 = (pointer)val._M_string_length;
          fmt_00.size_ = 0x4d1a;
          fmt_00.data_ = (char *)0x19;
          args_00.field_1.values_ = in_R9.values_;
          args_00.desc_ = (unsigned_long_long)local_e8;
          local_e8[0] = dVar6;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&mess,(v11 *)"[{}:{}]value {}=block[{}]",fmt_00,args_00);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&valstr,
                   (string *)&mess);
        std::__cxx11::string::~string((string *)&mess);
        if (this->skiplog == true) {
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)&valstr);
          std::operator<<(poVar4,'\n');
        }
        else {
          spdlog::info<std::__cxx11::string>(&valstr);
        }
        std::__cxx11::string::~string((string *)&valstr);
      }
      if ((this->valueCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
        psVar3 = Input::getTarget_abi_cxx11_(this_01);
        __args_1._M_str = (psVar3->_M_dataplus)._M_p;
        __args_1._M_len = psVar3->_M_string_length;
        __args_2._M_str = val._M_dataplus._M_p;
        __args_2._M_len = val._M_string_length;
        in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)val._M_dataplus;
        CLI::std::
        function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
        ::operator()(local_98,local_90,__args_1,__args_2);
      }
      std::__cxx11::string::~string((string *)&val);
    }
    this_01 = this_01 + 1;
    if (this_01 == pIVar5) {
      this_01 = *(_Map_pointer)((long)local_a0 + 8);
      local_a0 = (_Elt_pointer)((long)local_a0 + 8);
      pIVar5 = this_01 + 1;
    }
  }
  this_02 = (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>
            ._M_impl.super__Deque_impl_data._M_start._M_cur;
  local_68 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_start._M_last;
  local_98 = (function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
              *)(this->endpoints).
                super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
                super__Deque_impl_data._M_start._M_node;
  local_a0 = (this->endpoints).
             super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
             super__Deque_impl_data._M_finish._M_cur;
  while (this_02 != local_a0) {
    while( true ) {
      bVar2 = Endpoint::hasMessage(this_02);
      if (!bVar2) break;
      Endpoint::getMessage((Endpoint *)&mess);
      if (this->printMessage == true) {
        val._M_dataplus._M_p = (pointer)&val.field_2;
        val._M_string_length = 0;
        val.field_2._M_local_buf[0] = '\0';
        local_b8 = *(pointer *)
                    ((long)mess._M_t.
                           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                           .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x50);
        if (local_b8 < (pointer)0x32) {
          local_d8 = *(pointer *)
                      ((long)mess._M_t.
                             super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                             .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x90);
          sStack_d0 = *(size_type *)
                       ((long)mess._M_t.
                              super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                              .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x98);
          local_c8 = *(pointer *)
                      ((long)mess._M_t.
                             super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                             .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x70);
          sStack_c0 = *(size_type *)
                       ((long)mess._M_t.
                              super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                              .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x78);
          fmt_03.size_ = 0xddda;
          fmt_03.data_ = (char *)0x1d;
          args_03.field_1.values_ = in_R9.values_;
          args_03.desc_ = (unsigned_long_long)local_e8;
          local_e8[0] = dVar6;
          pcStack_b0 = local_b8;
          local_b8 = *(pointer *)
                      ((long)mess._M_t.
                             super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                             .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x60);
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&valstr,(v11 *)"[{}]message from {} to {}::{}",fmt_03,args_03);
        }
        else {
          local_d8 = *(pointer *)
                      ((long)mess._M_t.
                             super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                             .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x90);
          sStack_d0 = *(size_type *)
                       ((long)mess._M_t.
                              super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                              .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x98);
          local_c8 = *(pointer *)
                      ((long)mess._M_t.
                             super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                             .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x70);
          sStack_c0 = *(size_type *)
                       ((long)mess._M_t.
                              super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                              .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x78);
          fmt_04.size_ = 0x4dda;
          fmt_04.data_ = (char *)0x23;
          args_04.field_1.values_ = in_R9.values_;
          args_04.desc_ = (unsigned_long_long)local_e8;
          local_e8[0] = dVar6;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&valstr,(v11 *)"[{}]message from {} to {}:: size {}",fmt_04,args_04);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                   (string *)&valstr);
        std::__cxx11::string::~string((string *)&valstr);
        if (this->skiplog == true) {
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)&val);
          std::operator<<(poVar4,'\n');
        }
        else {
          spdlog::info<std::__cxx11::string>(&val);
        }
        std::__cxx11::string::~string((string *)&val);
      }
      if ((this->endpointMessageCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
        psVar3 = Interface::getName_abi_cxx11_(&this_02->super_Interface);
        local_58._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
        _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
        super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             mess._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
             ._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
             super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
        mess._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t
        .super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
        super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>)0x0;
        __args_1_00._M_str = (psVar3->_M_dataplus)._M_p;
        __args_1_00._M_len = psVar3->_M_string_length;
        CLI::std::
        function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
        ::operator()(&this->endpointMessageCallback,local_90,__args_1_00,
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_58
                    );
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  (&local_58);
      }
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&mess);
    }
    this_02 = this_02 + 1;
    if (this_02 == local_68) {
      this_02 = *(_Map_pointer)((long)local_98 + 8);
      local_98 = (function<void_(TimeRepresentation<count_time<9,_long>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                  *)((long)local_98 + 8);
      local_68 = this_02 + 4;
    }
  }
  this_00 = (this->cloneEndpoint)._M_t.
            super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t.
            super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
            super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl;
  if (this_00 != (Endpoint *)0x0) {
    while( true ) {
      bVar2 = Endpoint::hasMessage(this_00);
      if (!bVar2) break;
      Endpoint::getMessage((Endpoint *)&mess);
      if (this->printMessage == true) {
        val._M_dataplus._M_p = (pointer)&val.field_2;
        val._M_string_length = 0;
        val.field_2._M_local_buf[0] = '\0';
        local_b8 = *(pointer *)
                    ((long)mess._M_t.
                           super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                           ._M_t.
                           super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                           .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x50);
        if (local_b8 < (pointer)0x32) {
          local_d8 = *(pointer *)
                      ((long)mess._M_t.
                             super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                             .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x90);
          sStack_d0 = *(size_type *)
                       ((long)mess._M_t.
                              super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                              .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x98);
          local_c8 = *(pointer *)
                      ((long)mess._M_t.
                             super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                             .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xd0);
          sStack_c0 = *(size_type *)
                       ((long)mess._M_t.
                              super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                              .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xd8);
          fmt_05.size_ = 0xddda;
          fmt_05.data_ = (char *)0x1d;
          args_05.field_1.values_ = in_R9.values_;
          args_05.desc_ = (unsigned_long_long)local_e8;
          local_e8[0] = dVar6;
          pcStack_b0 = local_b8;
          local_b8 = *(pointer *)
                      ((long)mess._M_t.
                             super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                             .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x60);
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&valstr,(v11 *)"[{}]message from {} to {}::{}",fmt_05,args_05);
        }
        else {
          local_d8 = *(pointer *)
                      ((long)mess._M_t.
                             super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                             .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x90);
          sStack_d0 = *(size_type *)
                       ((long)mess._M_t.
                              super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                              .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0x98);
          local_c8 = *(pointer *)
                      ((long)mess._M_t.
                             super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                             .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xd0);
          sStack_c0 = *(size_type *)
                       ((long)mess._M_t.
                              super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>
                              .super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl + 0xd8);
          fmt_06.size_ = 0x4dda;
          fmt_06.data_ = (char *)0x23;
          args_06.field_1.values_ = in_R9.values_;
          args_06.desc_ = (unsigned_long_long)local_e8;
          local_e8[0] = dVar6;
          ::fmt::v11::vformat_abi_cxx11_
                    ((string *)&valstr,(v11 *)"[{}]message from %s to %s:: size %d",fmt_06,args_06);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&val,
                   (string *)&valstr);
        std::__cxx11::string::~string((string *)&valstr);
        if (this->skiplog == true) {
          poVar4 = std::operator<<((ostream *)&std::cout,(string *)&val);
          std::operator<<(poVar4,'\n');
        }
        else {
          spdlog::info<std::__cxx11::string>(&val);
        }
        std::__cxx11::string::~string((string *)&val);
      }
      if ((this->clonedMessageCallback).super__Function_base._M_manager != (_Manager_type)0x0) {
        local_60._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>.
        _M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
        super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             mess._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
             ._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
             super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl;
        mess._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>._M_t
        .super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
        super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl =
             (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
             (__uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>)0x0;
        CLI::std::
        function<void_(TimeRepresentation<count_time<9,_long>_>,_std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>)>
        ::operator()(&this->clonedMessageCallback,local_90,
                     (unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&local_60
                    );
        std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                  (&local_60);
      }
      std::unique_ptr<helics::Message,_std::default_delete<helics::Message>_>::~unique_ptr
                ((unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *)&mess);
      this_00 = (this->cloneEndpoint)._M_t.
                super___uniq_ptr_impl<helics::Endpoint,_std::default_delete<helics::Endpoint>_>._M_t
                .super__Tuple_impl<0UL,_helics::Endpoint_*,_std::default_delete<helics::Endpoint>_>.
                super__Head_base<0UL,_helics::Endpoint_*,_false>._M_head_impl;
    }
  }
  return;
}

Assistant:

void Tracer::captureForCurrentTime(Time currentTime, int iteration)
{
    for (auto& sub : subscriptions) {
        if (sub.isUpdated()) {
            auto val = sub.getValue<std::string>();

            if (printMessage) {
                std::string valstr;
                if (val.size() < 150) {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val);
                    } else {
                        valstr = fmt::format("[{}]value {}={}",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val);
                    }
                } else {
                    if (iteration > 0) {
                        valstr = fmt::format("[{}:{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             iteration,
                                             sub.getTarget(),
                                             val.size());
                    } else {
                        valstr = fmt::format("[{}]value {}=block[{}]",
                                             static_cast<double>(currentTime),
                                             sub.getTarget(),
                                             val.size());
                    }
                }
                if (skiplog) {
                    std::cout << valstr << '\n';
                } else {
                    spdlog::info(valstr);
                }
            }
            if (valueCallback) {
                valueCallback(currentTime, sub.getTarget(), val);
            }
        }
    }

    for (auto& ept : endpoints) {
        while (ept.hasMessage()) {
            auto mess = ept.getMessage();
            if (printMessage) {
                std::string messstr;
                if (mess->data.size() < 50) {
                    messstr = fmt::format("[{}]message from {} to {}::{}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->dest,
                                          mess->data.to_string());
                } else {
                    messstr = fmt::format("[{}]message from {} to {}:: size {}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->dest,
                                          mess->data.size());
                }
                if (skiplog) {
                    std::cout << messstr << '\n';
                } else {
                    spdlog::info(messstr);
                }
            }
            if (endpointMessageCallback) {
                endpointMessageCallback(currentTime, ept.getName(), std::move(mess));
            }
        }
    }

    // get the clone endpoints
    if (cloneEndpoint) {
        while (cloneEndpoint->hasMessage()) {
            auto mess = cloneEndpoint->getMessage();
            if (printMessage) {
                std::string messstr;
                if (mess->data.size() < 50) {
                    messstr = fmt::format("[{}]message from {} to {}::{}",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->original_dest,
                                          mess->data.to_string());
                } else {
                    messstr = fmt::format("[{}]message from %s to %s:: size %d",
                                          static_cast<double>(currentTime),
                                          mess->source,
                                          mess->original_dest,
                                          mess->data.size());
                }
                if (skiplog) {
                    std::cout << messstr << '\n';
                } else {
                    spdlog::info(messstr);
                }
            }
            if (clonedMessageCallback) {
                clonedMessageCallback(currentTime, std::move(mess));
            }
        }
    }
}